

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  ushort uVar1;
  undefined2 uVar2;
  Pgno PVar3;
  BtShared *pBt;
  Pager *pPager;
  BtLock *pBVar4;
  u8 *puVar5;
  MemPage *pMVar6;
  uint uVar7;
  uint uVar8;
  char cVar9;
  byte bVar10;
  u16 uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  u32 uVar15;
  u32 uVar16;
  u32 uVar17;
  BtLock **ppBVar18;
  Btree *pBVar19;
  uint uVar20;
  Wal *pWal;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  int local_44;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBt = p->pBt;
  pPager = pBt->pPager;
  sqlite3BtreeEnter(p);
  if ((p->inTrans == '\x02') || (wrflag == 0 && p->inTrans == '\x01')) {
LAB_00139b91:
    if (pSchemaVersion != (int *)0x0) {
      uVar17 = sqlite3Get4byte(pBt->pPage1->aData + 0x28);
      *pSchemaVersion = uVar17;
    }
    if (wrflag == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = sqlite3PagerOpenSavepoint(pPager,p->db->nSavepoint);
    }
    goto LAB_00139bc8;
  }
  if (((p->db->flags & 0x2000000) != 0) && (pPager->readOnly == '\0')) {
    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0xfe;
  }
  if ((wrflag != 0) && ((pBt->btsFlags & 1) != 0)) {
    uVar12 = 8;
    goto LAB_00139bc8;
  }
  cVar9 = (char)pBt->btsFlags;
  if (wrflag == 0) {
    if (cVar9 < '\0') goto LAB_001395e0;
  }
  else {
    if ((cVar9 < '\0') || (pBt->inTransaction == '\x02')) {
LAB_001395e0:
      pBVar19 = pBt->pWriter;
    }
    else {
      if (wrflag < 2) goto LAB_001395f8;
      ppBVar18 = &pBt->pLock;
      do {
        pBVar4 = *ppBVar18;
        if (pBVar4 == (BtLock *)0x0) goto LAB_001395f8;
        pBVar19 = pBVar4->pBtree;
        ppBVar18 = &pBVar4->pNext;
      } while (pBVar19 == p);
    }
    uVar12 = 0x106;
    if (pBVar19->db != (sqlite3 *)0x0) goto LAB_00139bc8;
  }
LAB_001395f8:
  uVar12 = querySharedCacheTableLock(p,1,'\x01');
  if (uVar12 == 0) {
    uVar1 = pBt->btsFlags;
    pBt->btsFlags = uVar1 & 0xffef;
    if (pBt->nPage == 0) {
      pBt->btsFlags = uVar1 | 0x10;
    }
    uVar12 = 0;
LAB_0013963b:
    do {
      if (pBt->pPage1 == (MemPage *)0x0) {
        uVar13 = sqlite3PagerSharedLock(pBt->pPager);
        if (uVar13 == 0) {
          local_40 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          uVar13 = btreeGetPage(pBt,1,&local_40,0);
          pMVar6 = local_40;
          if (uVar13 == 0) {
            puVar5 = local_40->aData;
            uVar17 = sqlite3Get4byte(puVar5 + 0x1c);
            uVar12 = pBt->pPager->dbSize;
            if ((uVar17 == 0) || (*(int *)(puVar5 + 0x18) != *(int *)(puVar5 + 0x5c))) {
              uVar17 = uVar12;
            }
            if (((pBt->db->flags & 0x2000000) == 0) && (uVar17 != 0)) {
              auVar21[0] = -(*puVar5 == 'S');
              auVar21[1] = -(puVar5[1] == 'Q');
              auVar21[2] = -(puVar5[2] == 'L');
              auVar21[3] = -(puVar5[3] == 'i');
              auVar21[4] = -(puVar5[4] == 't');
              auVar21[5] = -(puVar5[5] == 'e');
              auVar21[6] = -(puVar5[6] == ' ');
              auVar21[7] = -(puVar5[7] == 'f');
              auVar21[8] = -(puVar5[8] == 'o');
              auVar21[9] = -(puVar5[9] == 'r');
              auVar21[10] = -(puVar5[10] == 'm');
              auVar21[0xb] = -(puVar5[0xb] == 'a');
              auVar21[0xc] = -(puVar5[0xc] == 't');
              auVar21[0xd] = -(puVar5[0xd] == ' ');
              auVar21[0xe] = -(puVar5[0xe] == '3');
              auVar21[0xf] = -(puVar5[0xf] == '\0');
              uVar13 = 0x1a;
              if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
                if (2 < puVar5[0x12]) {
                  *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
                }
                if (puVar5[0x13] < 3) {
                  if ((puVar5[0x13] == 2) && ((pBt->btsFlags & 0x20) == 0)) {
                    local_44 = 0;
                    uVar13 = sqlite3PagerOpenWal(pBt->pPager,&local_44);
                    if (uVar13 == 0) {
                      if (local_44 != 0) goto LAB_0013997e;
                      releasePageOne(pMVar6);
                      uVar13 = 0;
                      goto LAB_00139890;
                    }
                  }
                  else {
LAB_0013997e:
                    iVar14 = bcmp(puVar5 + 0x15,"@  ",3);
                    uVar13 = 0x1a;
                    if (iVar14 == 0) {
                      uVar8 = (uint)puVar5[0x10] * 0x100;
                      uVar7 = (uint)puVar5[0x11] * 0x10000;
                      if ((0xffff00ff < (uVar7 + uVar8) - 0x10001) &&
                         (uVar20 = uVar7 | uVar8, ((uVar8 + uVar7) - 1 & uVar20) == 0)) {
                        bVar10 = puVar5[0x14];
                        uVar16 = uVar20 - bVar10;
                        if (uVar20 != pBt->pageSize) {
                          releasePageOne(pMVar6);
                          pBt->usableSize = uVar16;
                          pBt->pageSize = uVar20;
                          *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                          freeTempSpace(pBt);
                          uVar13 = sqlite3PagerSetPagesize(pBt->pPager,&pBt->pageSize,(uint)bVar10);
                          goto LAB_00139890;
                        }
                        if ((uVar12 < uVar17) &&
                           (uVar17 = uVar12, (pBt->db->flags & 0x10000001) != 1)) {
                          uVar13 = sqlite3CorruptError(0x121bd);
                        }
                        else {
                          uVar13 = 0x1a;
                          if (0x1df < uVar16) {
                            *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                            pBt->pageSize = uVar20;
                            pBt->usableSize = uVar16;
                            uVar15 = sqlite3Get4byte(puVar5 + 0x34);
                            pBt->autoVacuum = uVar15 != 0;
                            uVar15 = sqlite3Get4byte(puVar5 + 0x40);
                            pBt->incrVacuum = uVar15 != 0;
                            goto LAB_00139828;
                          }
                        }
                      }
                    }
                  }
                }
              }
              releasePageOne(pMVar6);
              pBt->pPage1 = (MemPage *)0x0;
            }
            else {
              uVar16 = pBt->usableSize;
              uVar17 = 0;
LAB_00139828:
              uVar13 = 0;
              iVar14 = (uVar16 * 0x40 - 0x300) / 0xff - 0x17;
              pBt->maxLocal = (ushort)iVar14;
              uVar11 = (short)((ulong)(uVar16 * 0x20 - 0x180) / 0xff) - 0x17;
              pBt->minLocal = uVar11;
              pBt->maxLeaf = (short)uVar16 - 0x23;
              if (0x7e < (ushort)iVar14) {
                iVar14 = 0x7f;
              }
              pBt->minLeaf = uVar11;
              pBt->max1bytePayload = (u8)iVar14;
              pBt->pPage1 = pMVar6;
              pBt->nPage = uVar17;
LAB_00139890:
              uVar12 = 0;
              if (uVar13 == 0) goto LAB_0013963b;
            }
          }
        }
      }
      else if ((wrflag == 0) || (uVar12 != 0)) {
LAB_001398f9:
        uVar13 = uVar12;
        if (uVar12 == 0) {
          if ((p->inTrans == '\0') &&
             (pBt->nTransaction = pBt->nTransaction + 1, p->sharable != '\0')) {
            (p->lock).eLock = '\x01';
            (p->lock).pNext = pBt->pLock;
            pBt->pLock = &p->lock;
          }
          bVar10 = 2 - (wrflag == 0);
          p->inTrans = bVar10;
          if (pBt->inTransaction < bVar10) {
            pBt->inTransaction = bVar10;
          }
          if (wrflag == 0) goto LAB_00139b91;
          pMVar6 = pBt->pPage1;
          pBt->pWriter = p;
          uVar2 = pBt->btsFlags;
          pBt->btsFlags = (ushort)(1 < wrflag) << 6 | uVar2 & 0xffbf;
          uVar17 = pBt->nPage;
          uVar16 = sqlite3Get4byte(pMVar6->aData + 0x1c);
          if (uVar17 == uVar16) goto LAB_00139b91;
          uVar12 = sqlite3PagerWrite(pMVar6->pDbPage);
          if (uVar12 == 0) {
            uVar12 = pBt->nPage;
            *(uint *)(pMVar6->aData + 0x1c) =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
            goto LAB_00139b91;
          }
          break;
        }
      }
      else {
        uVar13 = 8;
        if ((pBt->btsFlags & 1) == 0) {
          uVar13 = pPager->errCode;
          if (uVar13 == 0) {
            pPager->subjInMemory = p->db->temp_store == '\x02';
            if (pPager->eState == '\x01') {
              pWal = pPager->pWal;
              if (pWal != (Wal *)0x0) {
                if ((pPager->exclusiveMode != '\0') && (pWal->exclusiveMode == '\0')) {
                  uVar13 = pagerLockDb(pPager,4);
                  if (uVar13 != 0) goto LAB_0013966c;
                  sqlite3WalExclusiveMode(pPager->pWal,1);
                  pWal = pPager->pWal;
                }
                uVar13 = 8;
                if (pWal->readOnly != '\0') goto LAB_00139904;
                uVar13 = walLockExclusive(pWal,0,1);
                if (uVar13 != 0) goto LAB_0013966c;
                pWal->writeLock = '\x01';
                iVar14 = bcmp(&pWal->hdr,*pWal->apWiData,0x30);
                if (iVar14 == 0) goto LAB_001398d7;
                walUnlockExclusive(pWal,0,1);
                pWal->writeLock = '\0';
                goto LAB_00139679;
              }
              uVar13 = pagerLockDb(pPager,2);
              if (uVar13 == 0 && 1 < wrflag) {
                uVar13 = pager_wait_on_lock(pPager,4);
              }
              if (uVar13 != 0) goto LAB_0013966c;
LAB_001398d7:
              pPager->eState = '\x02';
              PVar3 = pPager->dbSize;
              pPager->dbHintSize = PVar3;
              pPager->dbFileSize = PVar3;
              pPager->dbOrigSize = PVar3;
              pPager->journalOff = 0;
            }
            uVar12 = newDatabase(pBt);
            goto LAB_001398f9;
          }
LAB_0013966c:
          if (uVar13 == 0x205) {
LAB_00139679:
            uVar13 = (uint)(pBt->inTransaction != '\0') << 9 | 5;
          }
        }
      }
LAB_00139904:
      uVar12 = uVar13;
      unlockBtreeIfUnused(pBt);
      if ((((char)uVar12 != '\x05') || (pBt->inTransaction != '\0')) ||
         (iVar14 = btreeInvokeBusyHandler(pBt), iVar14 == 0)) break;
    } while( true );
  }
LAB_00139bc8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  sqlite3BtreeLeave(p);
  return uVar12;
}

Assistant:

static SQLITE_NOINLINE int btreeBeginTrans(
  Btree *p,                 /* The btree in which to start the transaction */
  int wrflag,               /* True to start a write transaction */
  int *pSchemaVersion       /* Put schema version number here, if not NULL */
){
  BtShared *pBt = p->pBt;
  Pager *pPager = pBt->pPager;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase)
   && sqlite3PagerIsreadonly(pPager)==0
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on
  ** page 1. So if some other shared-cache client already has a write-lock
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, SCHEMA_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    sqlite3PagerWalDb(pPager, p->db);

#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    /* If transitioning from no transaction directly to a write transaction,
    ** block for the WRITER lock first if possible. */
    if( pBt->pPage1==0 && wrflag ){
      assert( pBt->inTransaction==TRANS_NONE );
      rc = sqlite3PagerWalWriteLock(pPager, 1);
      if( rc!=SQLITE_BUSY && rc!=SQLITE_OK ) break;
    }
#endif

    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pPager, wrflag>1, sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }

    if( rc!=SQLITE_OK ){
      (void)sqlite3PagerWalWriteLock(pPager, 0);
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerWalDb(pPager, 0);
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}